

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O3

uint32_t ATLget_hash(char *str)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  uVar5 = strlen(str);
  uVar1 = (int)uVar5 + 0xdeadbeef;
  uVar2 = uVar1;
  uVar7 = uVar1;
  if (((ulong)str & 3) == 0) {
    for (; 0xc < uVar5; uVar5 = uVar5 - 0xc) {
      uVar2 = uVar2 + *(int *)((long)str + 8);
      uVar1 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar1 + *(int *)str) - uVar2;
      iVar3 = uVar2 + uVar7 + *(int *)((long)str + 4);
      uVar2 = (uVar1 << 6 | uVar1 >> 0x1a) ^ (uVar7 + *(int *)((long)str + 4)) - uVar1;
      iVar6 = uVar1 + iVar3;
      uVar7 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar3 - uVar2;
      iVar3 = uVar2 + iVar6;
      uVar1 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar6 - uVar7;
      iVar6 = uVar7 + iVar3;
      uVar7 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar3 - uVar1;
      uVar1 = uVar1 + iVar6;
      str = (char *)((long)str + 0xc);
      uVar2 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar6 - uVar7;
      uVar7 = uVar7 + uVar1;
    }
    uVar4 = (*(code *)(&DAT_001090ec + *(int *)(&DAT_001090ec + uVar5 * 4)))
                      (uVar1,&DAT_001090ec,uVar7,&DAT_001090ec + *(int *)(&DAT_001090ec + uVar5 * 4)
                      );
    return uVar4;
  }
  if (((ulong)str & 1) != 0) {
    for (; 0xc < uVar5; uVar5 = uVar5 - 0xc) {
      iVar3 = (uint)((byte *)str)[7] * 0x1000000 + (uint)((byte *)str)[6] * 0x10000 +
              (uint)((byte *)str)[5] * 0x100 + ((byte *)str)[4] + uVar7;
      uVar2 = (uint)((byte *)str)[0xb] * 0x1000000 + (uint)((byte *)str)[10] * 0x10000 +
              (uint)((byte *)str)[9] * 0x100 + ((byte *)str)[8] + uVar2;
      uVar1 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^
              ((uint)((byte *)str)[3] * 0x1000000 + (uint)((byte *)str)[2] * 0x10000 +
              (uint)((byte *)str)[1] * 0x100 + (byte)*str + uVar1) - uVar2;
      iVar6 = uVar2 + iVar3;
      uVar2 = (uVar1 << 6 | uVar1 >> 0x1a) ^ iVar3 - uVar1;
      iVar3 = uVar1 + iVar6;
      uVar7 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar6 - uVar2;
      iVar6 = uVar2 + iVar3;
      uVar1 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar3 - uVar7;
      iVar3 = uVar7 + iVar6;
      uVar7 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar6 - uVar1;
      uVar1 = uVar1 + iVar3;
      str = (char *)((byte *)str + 0xc);
      uVar2 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar3 - uVar7;
      uVar7 = uVar7 + uVar1;
    }
    uVar4 = (*(code *)(&DAT_00109084 + *(int *)(&DAT_00109084 + uVar5 * 4)))
                      (uVar1,&DAT_00109084,uVar7,&DAT_00109084 + *(int *)(&DAT_00109084 + uVar5 * 4)
                      );
    return uVar4;
  }
  for (; 0xc < uVar5; uVar5 = uVar5 - 0xc) {
    uVar2 = uVar2 + *(int *)((long)str + 8);
    uVar1 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar1 + *(int *)str) - uVar2;
    iVar3 = uVar2 + uVar7 + *(int *)((long)str + 4);
    uVar2 = (uVar1 << 6 | uVar1 >> 0x1a) ^ (uVar7 + *(int *)((long)str + 4)) - uVar1;
    iVar6 = uVar1 + iVar3;
    uVar7 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar3 - uVar2;
    iVar3 = uVar2 + iVar6;
    uVar1 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar6 - uVar7;
    iVar6 = uVar7 + iVar3;
    uVar7 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar3 - uVar1;
    uVar1 = uVar1 + iVar6;
    str = (char *)((long)str + 0xc);
    uVar2 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar6 - uVar7;
    uVar7 = uVar7 + uVar1;
  }
  uVar4 = (*(code *)(&DAT_001090b8 + *(int *)(&DAT_001090b8 + uVar5 * 4)))
                    (&DAT_001090b8,uVar1,uVar7,&DAT_001090b8 + *(int *)(&DAT_001090b8 + uVar5 * 4));
  return uVar4;
}

Assistant:

uint32_t
ATLget_hash(const char*str)
{
    return hashlittle(str, strlen(str), 0);
}